

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

int __thiscall
vkt::memory::anon_unknown_0::ImageCopyFromImage::verify
          (ImageCopyFromImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  PixelBufferAccess *this_00;
  int extraout_EAX;
  TextureLevel *this_01;
  Vector<unsigned_int,_4> local_90;
  byte local_80;
  byte local_7f;
  byte local_7e;
  byte local_7d;
  int local_7c;
  deUint8 a8;
  deUint8 b8;
  deUint8 g8;
  deUint8 r8;
  deInt32 x;
  deInt32 y;
  PixelBufferAccess local_68;
  PixelBufferAccess *local_40;
  PixelBufferAccess *refAccess;
  Random rng;
  ReferenceMemory_conflict *reference;
  size_t param_2_local;
  VerifyContext *context_local;
  ImageCopyFromImage *this_local;
  
  rng.m_rnd._8_8_ = VerifyContext::getReference((VerifyContext *)ctx);
  de::Random::Random((Random *)&refAccess,this->m_seed);
  ReferenceMemory::setUndefined((ReferenceMemory *)rng.m_rnd._8_8_,0,this->m_imageMemorySize);
  this_01 = VerifyContext::getReferenceImage((VerifyContext *)ctx);
  tcu::TextureLevel::getAccess(&local_68,this_01);
  local_40 = &local_68;
  for (_a8 = 0; _a8 < this->m_imageHeight; _a8 = _a8 + 1) {
    for (local_7c = 0; local_7c < this->m_imageWidth; local_7c = local_7c + 1) {
      local_7d = de::Random::getUint8((Random *)&refAccess);
      local_7e = de::Random::getUint8((Random *)&refAccess);
      local_7f = de::Random::getUint8((Random *)&refAccess);
      local_80 = de::Random::getUint8((Random *)&refAccess);
      this_00 = local_40;
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_90,(uint)local_7d,(uint)local_7e,(uint)local_7f,(uint)local_80);
      tcu::PixelBufferAccess::setPixel(this_00,&local_90,local_7c,_a8,0);
    }
  }
  de::Random::~Random((Random *)&refAccess);
  return extraout_EAX;
}

Assistant:

void ImageCopyFromImage::verify (VerifyContext& context, size_t)
{
	ReferenceMemory&	reference	(context.getReference());
	de::Random			rng			(m_seed);

	reference.setUndefined(0, (size_t)m_imageMemorySize);

	{
		const PixelBufferAccess&	refAccess	(context.getReferenceImage().getAccess());

		for (deInt32 y = 0; y < m_imageHeight; y++)
		for (deInt32 x = 0; x < m_imageWidth; x++)
		{
			const deUint8 r8 = rng.getUint8();
			const deUint8 g8 = rng.getUint8();
			const deUint8 b8 = rng.getUint8();
			const deUint8 a8 = rng.getUint8();

			refAccess.setPixel(UVec4(r8, g8, b8, a8), x, y);
		}
	}
}